

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotest.cpp
# Opt level: O1

void Test::showFinalResult(void)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  if (failedNum == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"All ",4);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,totalNum);
    pcVar3 = " tests passed!";
    lVar2 = 0xe;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Failed in ",10);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,failedNum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," out of ",8);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,totalNum);
    pcVar3 = " tests!";
    lVar2 = 7;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Test::showFinalResult() {
    if (!failedNum) {
        std::cout << "All " << totalNum << " tests passed!" << std::endl;
    } else {
        std::cout << "Failed in " << failedNum << " out of " << totalNum << " tests!" << std::endl;
    }
}